

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void __thiscall FParser::SF_SpawnMissile(FParser *this)

{
  bool bVar1;
  svalue_t local_40;
  PClassActor *local_28;
  PClassActor *pclass;
  AActor *target;
  AActor *mobj;
  FParser *this_local;
  
  mobj = (AActor *)this;
  bVar1 = CheckArgs(this,3);
  if (bVar1) {
    svalue_t::svalue_t(&local_40,this->t_argv + 2);
    local_28 = T_GetMobjType(&local_40);
    bVar1 = local_28 != (PClassActor *)0x0;
    svalue_t::~svalue_t(&local_40);
    if (bVar1) {
      target = actorvalue(this->t_argv);
      pclass = (PClassActor *)actorvalue(this->t_argv + 1);
      if ((target != (AActor *)0x0) && ((AActor *)pclass != (AActor *)0x0)) {
        P_SpawnMissile(target,(AActor *)pclass,local_28,(AActor *)0x0);
      }
    }
  }
  return;
}

Assistant:

void FParser::SF_SpawnMissile()
{
	AActor *mobj;
	AActor *target;
	PClassActor * pclass;

	if (CheckArgs(3))
	{
		if (!(pclass=T_GetMobjType(t_argv[2]))) return;

		mobj = actorvalue(t_argv[0]);
		target = actorvalue(t_argv[1]);
		if (mobj && target) P_SpawnMissile(mobj, target, pclass);
	}
}